

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::LookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,
          MapValueConstRef *val)

{
  bool bVar1;
  int iVar2;
  Descriptor *this_00;
  FieldDescriptor *pFVar3;
  MapFieldBase *pMVar4;
  string local_60;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  bVar1 = anon_unknown_0::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"LookupMapValue\"","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"value","");
  pFVar3 = Descriptor::FindFieldByName(this_00,&local_60);
  if (*(once_flag **)(pFVar3 + 0x18) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = pFVar3;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar3 + 0x18),&local_38,&local_40);
  }
  val->type_ = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar3[2] * 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  pMVar4 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
  iVar2 = (*pMVar4->_vptr_MapFieldBase[4])(pMVar4,key,val);
  return SUB41(iVar2,0);
}

Assistant:

bool Reflection::LookupMapValue(const Message& message,
                                const FieldDescriptor* field, const MapKey& key,
                                MapValueConstRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "LookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return GetRaw<MapFieldBase>(message, field).LookupMapValue(key, val);
}